

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.h
# Opt level: O0

QMetaEnum QMetaEnum::fromType<QDBusListener::Setting>(void)

{
  QMetaEnum QVar1;
  QMetaObject *pQVar2;
  char *name;
  QMetaObject *metaObject;
  
  pQVar2 = ::qt_getEnumMetaObject(Theme);
  ::qt_getEnumName(Theme);
  QMetaObject::indexOfEnumerator((char *)pQVar2);
  QVar1 = (QMetaEnum)QMetaObject::enumerator((int)pQVar2);
  return QVar1;
}

Assistant:

static QMetaEnum fromType()
    {
        static_assert(QtPrivate::IsQEnumHelper<T>::Value,
                      "QMetaEnum::fromType only works with enums declared as "
                      "Q_ENUM, Q_ENUM_NS, Q_FLAG or Q_FLAG_NS");
        const QMetaObject *metaObject = qt_getEnumMetaObject(T());
        const char *name = qt_getEnumName(T());
        return metaObject->enumerator(metaObject->indexOfEnumerator(name));
    }